

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  byte *pbVar1;
  curl_trc_feat *pcVar2;
  byte bVar3;
  unsigned_short uVar4;
  CURLcode CVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  undefined6 extraout_var;
  ulong uVar9;
  altsvc *p;
  time_t tVar10;
  uint uVar11;
  undefined8 uVar12;
  size_t dlen;
  char *pcVar13;
  undefined6 in_register_0000008a;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  byte *local_c0;
  uint local_b8;
  alpnid local_b4;
  uint local_b0;
  alpnid local_ac;
  uint local_a8;
  uint local_a4;
  char *end_ptr;
  long local_98;
  byte *local_90;
  char alpnbuf [10];
  ulong local_70;
  char option [32];
  
  alpnbuf[8] = '\0';
  alpnbuf[9] = '\0';
  alpnbuf[0] = '\0';
  alpnbuf[1] = '\0';
  alpnbuf[2] = '\0';
  alpnbuf[3] = '\0';
  alpnbuf[4] = '\0';
  alpnbuf[5] = '\0';
  alpnbuf[6] = '\0';
  alpnbuf[7] = '\0';
  local_c0 = (byte *)value;
  CVar5 = getalnum((char **)&local_c0,alpnbuf,10);
  if (CVar5 == CURLE_OK) {
    iVar6 = curl_strequal(alpnbuf,"clear");
    local_b0 = (uint)srcport;
    if (iVar6 == 0) {
      local_a4 = (uint)CONCAT62(in_register_0000008a,srcport);
      uVar8 = (ulong)*local_c0;
      local_98 = 0;
      local_ac = srcalpnid;
      do {
        pbVar15 = local_c0;
        if ((char)uVar8 != '=') {
          return CURLE_OK;
        }
        local_b4 = alpn2alpnid(alpnbuf);
        if (pbVar15[1] != 0x22) {
          return CURLE_OK;
        }
        pbVar14 = pbVar15 + 2;
        bVar3 = pbVar15[2];
        if (bVar3 == 0x3a) {
          local_c0 = pbVar14;
          dlen = strlen(srchost);
          bVar16 = true;
          local_90 = (byte *)srchost;
LAB_00110ffa:
          pbVar15 = pbVar14 + 1;
          local_c0 = pbVar15;
          pbVar1 = pbVar15;
          if (((((byte)(pbVar14[1] - 0x30) < 10) &&
               (uVar8 = strtoul((char *)pbVar15,&end_ptr,10), pcVar13 = end_ptr,
               pbVar1 = (byte *)end_ptr, 0xffffffffffff0000 < uVar8 - 0x10000)) &&
              ((byte *)end_ptr != pbVar15)) && (*end_ptr == '\"')) {
            uVar4 = curlx_ultous(uVar8);
            local_a4 = (uint)CONCAT62(extraout_var,uVar4);
            pbVar15 = (byte *)pcVar13;
          }
          else {
            end_ptr = (char *)pbVar1;
            if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
               ((pcVar2 = (data->state).feat, pcVar2 != (curl_trc_feat *)0x0 &&
                (pcVar2->log_level < 1)))) {
              bVar16 = false;
            }
            else {
              bVar16 = false;
              Curl_infof(data,"Unknown alt-svc port number, ignoring.");
            }
          }
        }
        else {
          if (bVar3 == 0x5b) {
            local_c0 = pbVar15 + 3;
            sVar7 = strspn((char *)local_c0,"0123456789abcdefABCDEF:.");
            if (pbVar15[sVar7 + 3] != 0x5d) {
              return CURLE_OK;
            }
            dlen = sVar7 + 2;
            pbVar15 = pbVar15 + sVar7 + 4;
          }
          else {
            dlen = 0;
            pbVar15 = pbVar14;
            while ((bVar3 != 0 &&
                   (((byte)(bVar3 + 0x9f) < 0x1a || (byte)(bVar3 - 0x30) < 10 ||
                    ((byte)(bVar3 + 0xbf) < 0x1a || (byte)(bVar3 - 0x2d) < 2))))) {
              pbVar1 = pbVar15 + 1;
              pbVar15 = pbVar15 + 1;
              dlen = dlen + 1;
              bVar3 = *pbVar1;
            }
          }
          bVar16 = dlen - 1 < 0x1ff;
          if (!bVar16) {
            pbVar14 = (byte *)0x17889b;
          }
          if (data != (Curl_easy *)0x0 && !bVar16) {
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              local_c0 = pbVar15;
              Curl_infof(data,"Excessive alt-svc hostname, ignoring.");
            }
            bVar16 = false;
            pbVar14 = (byte *)0x17889b;
          }
          local_90 = pbVar14;
          pbVar14 = pbVar15;
          if (*pbVar15 == 0x3a) goto LAB_00110ffa;
        }
        if (*pbVar15 != 0x22) {
          return CURLE_OK;
        }
        local_70 = 0x15180;
        local_a8 = 0;
        local_b8 = 0;
        pbVar15 = pbVar15 + 1;
        uVar8 = local_70;
        while( true ) {
          do {
            do {
              local_70 = uVar8;
              pbVar14 = pbVar15;
              uVar11 = local_a4;
              local_c0 = pbVar14 + 1;
              bVar3 = *pbVar14;
              pbVar15 = local_c0;
              uVar8 = local_70;
            } while (bVar3 == 9);
          } while (bVar3 == 0x20);
          if ((bVar3 != 0x3b) ||
             ((*local_c0 < 0xe && (pbVar14 = local_c0, (0x2401U >> (*local_c0 & 0x1f) & 1) != 0))))
          break;
          CVar5 = getalnum((char **)&local_c0,option,0x20);
          pbVar14 = local_c0;
          if (CVar5 != CURLE_OK) {
            option[0] = '\0';
          }
          while( true ) {
            pbVar14 = pbVar14 + 1;
            bVar3 = *local_c0;
            uVar12 = 0;
            if ((bVar3 != 9) && (bVar3 != 0x20)) break;
            local_c0 = local_c0 + 1;
          }
          if (bVar3 != 0x3d) {
            return CURLE_OK;
          }
          for (; (bVar3 = *pbVar14, bVar3 == 9 || (bVar3 == 0x20)); pbVar14 = pbVar14 + 1) {
          }
          if (bVar3 == 0) {
            return CURLE_OK;
          }
          if (bVar3 == 0x22) {
            pbVar14 = pbVar14 + 1;
            pbVar1 = pbVar14;
LAB_00111196:
            do {
              pbVar15 = pbVar1 + 1;
              bVar3 = *pbVar1;
              if (bVar3 == 0) break;
              pbVar1 = pbVar15;
            } while (bVar3 != 0x22);
            local_a8 = (uint)CONCAT71((int7)((ulong)uVar12 >> 8),1);
            if (bVar3 == 0) {
              return CURLE_OK;
            }
          }
          else {
            uVar12 = 0x800100100000201;
            pbVar15 = pbVar14;
            pbVar1 = pbVar14;
            if ((local_a8 & 1) != 0) goto LAB_00111196;
            while ((0x3b < (ulong)*pbVar15 ||
                   ((0x800100100000201U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))) {
              pbVar15 = pbVar15 + 1;
            }
          }
          local_c0 = pbVar15;
          uVar9 = strtoul((char *)pbVar14,&end_ptr,10);
          if ((uVar9 != 0xffffffffffffffff && (byte *)end_ptr != pbVar14) &&
             (iVar6 = curl_strequal("ma",option), uVar8 = uVar9, iVar6 == 0)) {
            iVar6 = curl_strequal("persist",option);
            uVar11 = local_b8 & 0xff;
            local_b8 = uVar11;
            if (uVar9 == 1) {
              local_b8 = 1;
            }
            uVar8 = local_70;
            if (iVar6 == 0) {
              local_b8 = uVar11;
            }
          }
        }
        local_c0 = pbVar14;
        if (!(bool)(bVar16 ^ 1U | local_b4 == ALPN_none)) {
          if (local_98 == 0) {
            altsvc_flush(asi,local_ac,srchost,(unsigned_short)local_b0);
          }
          local_98 = local_98 + 1;
          p = altsvc_createid(srchost,(char *)local_90,dlen,local_ac,local_b4,local_b0,
                              uVar11 & 0xffff);
          if (p != (altsvc *)0x0) {
            tVar10 = time((time_t *)0x0);
            p->expires = tVar10 + local_70;
            p->persist = (_Bool)((byte)local_b8 & 1);
            Curl_llist_append(&asi->list,p,&p->node);
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              pcVar13 = "h1";
              if (local_b4 != ALPN_h1) {
                if (local_b4 == ALPN_h3) {
                  pcVar13 = "h3";
                }
                else if (local_b4 == ALPN_h2) {
                  pcVar13 = "h2";
                }
                else {
                  pcVar13 = "";
                }
              }
              Curl_infof(data,"Added alt-svc: %s:%d over %s",local_90,(ulong)(uVar11 & 0xffff),
                         pcVar13);
            }
          }
        }
        bVar3 = *local_c0;
        if (bVar3 == 0x2c) {
          local_c0 = local_c0 + 1;
          CVar5 = getalnum((char **)&local_c0,alpnbuf,10);
          if (CVar5 != CURLE_OK) {
            return CURLE_OK;
          }
          bVar3 = *local_c0;
        }
        uVar8 = (ulong)bVar3;
      } while ((0x3b < bVar3) || ((0x800000000002401U >> (uVar8 & 0x3f) & 1) == 0));
    }
    else {
      altsvc_flush(asi,srcalpnid,srchost,srcport);
    }
  }
  else if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) {
    Curl_infof(data,"Excessive alt-svc header, ignoring.");
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        size_t dstlen = 0; /* destination hostname length */
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            dstlen = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[dstlen] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            dstlen += 2;
            p = &p[dstlen-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            dstlen = p - hostp;
          }
          if(!dstlen || (dstlen >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            dsthost = hostp;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
          dstlen = strlen(srchost);
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost, dstlen,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}